

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.h
# Opt level: O0

void __thiscall
glslang::TInfoSinkBase::location
          (TInfoSinkBase *this,TSourceLoc *loc,bool absolute,bool displayColumn)

{
  char *pcVar1;
  path local_138;
  path local_110;
  string local_e8;
  undefined1 local_c8 [8];
  string location;
  path local_80;
  string local_58;
  char local_38 [8];
  char locText [24];
  int maxSize;
  bool displayColumn_local;
  bool absolute_local;
  TSourceLoc *loc_local;
  TInfoSinkBase *this_local;
  
  locText[0x10] = '\x18';
  locText[0x11] = '\0';
  locText[0x12] = '\0';
  locText[0x13] = '\0';
  locText[0x16] = displayColumn;
  locText[0x17] = absolute;
  if (displayColumn) {
    snprintf(local_38,0x18,":%d:%d",(ulong)(uint)loc->line,(ulong)(uint)loc->column);
  }
  else {
    snprintf(local_38,0x18,":%d",(ulong)(uint)loc->line);
  }
  pcVar1 = TSourceLoc::getFilename(loc);
  if (((pcVar1 == (char *)0x0) && (this->shaderFileName != (char *)0x0)) &&
     ((locText[0x17] & 1U) != 0)) {
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              ((path *)((long)&location.field_2 + 8),&this->shaderFileName,auto_format);
    std::filesystem::absolute(&local_80);
    std::filesystem::__cxx11::path::string(&local_58,&local_80);
    append(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::filesystem::__cxx11::path::~path(&local_80);
    std::filesystem::__cxx11::path::~path((path *)((long)&location.field_2 + 8));
  }
  else {
    TSourceLoc::getStringNameOrNum_abi_cxx11_((string *)local_c8,loc,false);
    if ((locText[0x17] & 1U) == 0) {
      append(this,(TPersistString *)local_c8);
    }
    else {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 auto_format);
      std::filesystem::absolute(&local_110);
      std::filesystem::__cxx11::path::string(&local_e8,&local_110);
      append(this,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::filesystem::__cxx11::path::~path(&local_110);
      std::filesystem::__cxx11::path::~path(&local_138);
    }
    std::__cxx11::string::~string((string *)local_c8);
  }
  append(this,local_38);
  append(this,": ");
  return;
}

Assistant:

void location(const TSourceLoc& loc, bool absolute = false, bool displayColumn = false) {
        const int maxSize = 24;
        char locText[maxSize];
        if (displayColumn) {
            snprintf(locText, maxSize, ":%d:%d", loc.line, loc.column);
        } else {
            snprintf(locText, maxSize, ":%d", loc.line);
        }

        if(loc.getFilename() == nullptr && shaderFileName != nullptr && absolute) {
            append(std::filesystem::absolute(shaderFileName).string());
        } else {
            std::string location = loc.getStringNameOrNum(false);
            if (absolute) {
                append(std::filesystem::absolute(location).string());
            } else {
                append(location);
            }
        }

        append(locText);
        append(": ");
    }